

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_tensor * ggml_mul_mat(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b)

{
  int n_dims;
  bool bVar1;
  ggml_tensor *pgVar2;
  ggml_tensor *pgVar3;
  char in_CL;
  ggml_tensor *extraout_RDX;
  ggml_tensor *b_00;
  int ne [4];
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  
  if (((a->ne[0] == b->ne[0]) && (local_40 = a->ne[2], local_40 == b->ne[2])) &&
     (local_3c = a->ne[3], local_3c == b->ne[3])) {
    if ((a->grad == (ggml_tensor *)0x0) && (b->grad == (ggml_tensor *)0x0)) {
      bVar1 = false;
    }
    else {
      bVar1 = true;
    }
    local_48 = a->ne[1];
    local_44 = b->ne[1];
    n_dims = b->n_dims;
    if (a->n_dims < b->n_dims) {
      n_dims = a->n_dims;
    }
    pgVar3 = (ggml_tensor *)0x0;
    pgVar2 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,n_dims,&local_48,(void *)0x0);
    pgVar2->op = GGML_OP_MUL_MAT;
    if (bVar1) {
      pgVar3 = ggml_new_tensor_impl(ctx,pgVar2->type,pgVar2->n_dims,pgVar2->ne,(void *)0x0);
    }
    pgVar2->grad = pgVar3;
    pgVar2->src0 = a;
    pgVar2->src1 = b;
    return pgVar2;
  }
  ggml_mul_mat_cold_1();
  if (((extraout_RDX->ne[0] == 1) && (extraout_RDX->ne[1] == 1)) &&
     ((extraout_RDX->ne[2] == 1 && (extraout_RDX->ne[3] == 1)))) {
    pgVar2 = (ggml_tensor *)(ulong)a->type;
    if (((a->nb[0] == GGML_TYPE_SIZE[(long)pgVar2]) && (a->nb[2] == (long)a->ne[1] * a->nb[1])) &&
       (a->nb[3] == a->nb[2] * (long)a->ne[2])) {
      if ((in_CL != '\0') ||
         ((a->grad == (ggml_tensor *)0x0 && (extraout_RDX->grad == (ggml_tensor *)0x0)))) {
        pgVar2 = ggml_new_tensor_impl(ctx,a->type,a->n_dims,a->ne,a->data);
        pgVar2->op = GGML_OP_SCALE;
        pgVar2->grad = (ggml_tensor *)0x0;
        pgVar2->src0 = a;
        pgVar2->src1 = extraout_RDX;
        return pgVar2;
      }
      goto LAB_0012094d;
    }
  }
  else {
    ggml_scale_impl_cold_1();
    pgVar2 = a;
  }
  ggml_scale_impl_cold_2();
LAB_0012094d:
  ggml_scale_impl_cold_3();
  pgVar2 = ggml_scale_impl(ctx,pgVar2,b_00,false);
  return pgVar2;
}

Assistant:

struct ggml_tensor * ggml_mul_mat(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b) {
    GGML_ASSERT(ggml_can_mul_mat(a, b));

    bool is_node = false;

    if (a->grad || b->grad) {
        is_node = true;
    }

    const int ne[4] = { a->ne[1], b->ne[1], a->ne[2], b->ne[3] };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, MIN(a->n_dims, b->n_dims), ne);

    result->op   = GGML_OP_MUL_MAT;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = b;

    return result;
}